

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addImplicitElems
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this)

{
  Module *module;
  __single_object _Var1;
  mapped_type mVar2;
  reference this_00;
  pointer pEVar3;
  Const *pCVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  Ok local_81;
  mapped_type local_80;
  key_type local_7c;
  Index elemIndex;
  Index tableIndex;
  string_view local_68;
  Type local_58;
  Builder local_50 [3];
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> local_38;
  __single_object e;
  Table *table;
  ElemListT *elems_local;
  ParseDeclsCtx *this_local;
  
  this_00 = std::
            vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ::back(&this->wasm->tables);
  e._M_t.super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
       )std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator*(this_00);
  std::make_unique<wasm::ElementSegment>();
  _Var1._M_t.super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
  ._M_t.super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
       e._M_t.
       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
       super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
  pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(&local_38);
  wasm::Name::operator=
            (&pEVar3->table,
             (Name *)_Var1._M_t.
                     super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                     .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl);
  Builder::Builder(local_50,this->wasm);
  wasm::Type::Type(&local_58,i32);
  pCVar4 = Builder::makeConstPtr(local_50,0,local_58);
  pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(&local_38);
  pEVar3->offset = (Expression *)pCVar4;
  module = this->wasm;
  wasm::Name::Name((Name *)&elemIndex,"implicit-elem");
  local_68 = (string_view)Names::getValidElementSegmentName(module,(Name)_elemIndex);
  pEVar3 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(&local_38);
  wasm::Name::operator=((Name *)pEVar3,(Name *)&local_68);
  Module::addElementSegment(this->wasm,&local_38);
  sVar5 = std::
          vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ::size(&this->wasm->tables);
  local_7c = (int)sVar5 - 1;
  sVar5 = std::
          vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
          ::size(&this->wasm->elementSegments);
  mVar2 = (int)sVar5 - 1;
  local_80 = mVar2;
  pmVar6 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->implicitElemIndices,&local_7c);
  *pmVar6 = mVar2;
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_81);
  std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
            (&local_38);
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addImplicitElems(TypeT, ElemListT&& elems) {
  auto& table = *wasm.tables.back();
  auto e = std::make_unique<ElementSegment>();
  e->table = table.name;
  e->offset = Builder(wasm).makeConstPtr(0, Type::i32);
  e->name = Names::getValidElementSegmentName(wasm, "implicit-elem");
  wasm.addElementSegment(std::move(e));

  // Record the index mapping so we can find this segment again to set its type
  // and elements in later phases.
  Index tableIndex = wasm.tables.size() - 1;
  Index elemIndex = wasm.elementSegments.size() - 1;
  implicitElemIndices[tableIndex] = elemIndex;

  return Ok{};
}